

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

string * __thiscall
cmInstallCommand::GetDestinationForType
          (string *__return_storage_ptr__,cmInstallCommand *this,cmInstallCommandArguments *args,
          string *type)

{
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  allocator<char> local_29;
  string *local_28;
  string *type_local;
  cmInstallCommandArguments *args_local;
  cmInstallCommand *this_local;
  
  local_28 = type;
  type_local = (string *)args;
  args_local = (cmInstallCommandArguments *)this;
  this_local = (cmInstallCommand *)__return_storage_ptr__;
  if (args != (cmInstallCommandArguments *)0x0) {
    cmInstallCommandArguments::GetDestination_abi_cxx11_(args);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      psVar3 = cmInstallCommandArguments::GetDestination_abi_cxx11_
                         ((cmInstallCommandArguments *)type_local);
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
      return __return_storage_ptr__;
    }
  }
  bVar1 = std::operator==(local_28,"BIN");
  if (bVar1) {
    GetRuntimeDestination_abi_cxx11_(__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
  }
  else {
    bVar1 = std::operator==(local_28,"SBIN");
    if (bVar1) {
      GetSbinDestination_abi_cxx11_(__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
    }
    else {
      bVar1 = std::operator==(local_28,"SYSCONF");
      if (bVar1) {
        GetSysconfDestination_abi_cxx11_
                  (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
      }
      else {
        bVar1 = std::operator==(local_28,"SHAREDSTATE");
        if (bVar1) {
          GetSharedStateDestination_abi_cxx11_
                    (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
        }
        else {
          bVar1 = std::operator==(local_28,"LOCALSTATE");
          if (bVar1) {
            GetLocalStateDestination_abi_cxx11_
                      (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
          }
          else {
            bVar1 = std::operator==(local_28,"RUNSTATE");
            if (bVar1) {
              GetRunStateDestination_abi_cxx11_
                        (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
            }
            else {
              bVar1 = std::operator==(local_28,"LIB");
              if (bVar1) {
                GetLibraryDestination_abi_cxx11_
                          (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
              }
              else {
                bVar1 = std::operator==(local_28,"INCLUDE");
                if (bVar1) {
                  GetIncludeDestination_abi_cxx11_
                            (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
                }
                else {
                  bVar1 = std::operator==(local_28,"DATA");
                  if (bVar1) {
                    GetDataDestination_abi_cxx11_
                              (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
                  }
                  else {
                    bVar1 = std::operator==(local_28,"INFO");
                    if (bVar1) {
                      GetInfoDestination_abi_cxx11_
                                (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
                    }
                    else {
                      bVar1 = std::operator==(local_28,"LOCALE");
                      if (bVar1) {
                        GetLocaleDestination_abi_cxx11_
                                  (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
                      }
                      else {
                        bVar1 = std::operator==(local_28,"MAN");
                        if (bVar1) {
                          GetManDestination_abi_cxx11_
                                    (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0);
                        }
                        else {
                          bVar1 = std::operator==(local_28,"DOC");
                          if (bVar1) {
                            GetDocDestination_abi_cxx11_
                                      (__return_storage_ptr__,this,(cmInstallCommandArguments *)0x0)
                            ;
                          }
                          else {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)__return_storage_ptr__,"",&local_29);
                            std::allocator<char>::~allocator(&local_29);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallCommand::GetDestinationForType(
  const cmInstallCommandArguments* args, const std::string& type)
{
  if (args && !args->GetDestination().empty()) {
    return args->GetDestination();
  }
  if (type == "BIN") {
    return this->GetRuntimeDestination(nullptr);
  }
  if (type == "SBIN") {
    return this->GetSbinDestination(nullptr);
  }
  if (type == "SYSCONF") {
    return this->GetSysconfDestination(nullptr);
  }
  if (type == "SHAREDSTATE") {
    return this->GetSharedStateDestination(nullptr);
  }
  if (type == "LOCALSTATE") {
    return this->GetLocalStateDestination(nullptr);
  }
  if (type == "RUNSTATE") {
    return this->GetRunStateDestination(nullptr);
  }
  if (type == "LIB") {
    return this->GetLibraryDestination(nullptr);
  }
  if (type == "INCLUDE") {
    return this->GetIncludeDestination(nullptr);
  }
  if (type == "DATA") {
    return this->GetDataDestination(nullptr);
  }
  if (type == "INFO") {
    return this->GetInfoDestination(nullptr);
  }
  if (type == "LOCALE") {
    return this->GetLocaleDestination(nullptr);
  }
  if (type == "MAN") {
    return this->GetManDestination(nullptr);
  }
  if (type == "DOC") {
    return this->GetDocDestination(nullptr);
  }
  return "";
}